

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

bool units::cleanUnitStringPhase2(string *unit_string)

{
  size_type sVar1;
  bool bVar2;
  undefined8 in_RAX;
  void *pvVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  size_t __n;
  pointer __s;
  pointer pcVar5;
  size_type __size;
  size_t __n_00;
  ulong __pos;
  undefined8 uStack_38;
  
  sVar1 = unit_string->_M_string_length;
  uStack_38 = in_RAX;
  bVar2 = bracketModifiers(unit_string);
  __n_00 = unit_string->_M_string_length;
  if (__n_00 == 0) {
    __n_00 = 0;
  }
  else {
    pcVar5 = (unit_string->_M_dataplus)._M_p;
    pvVar3 = memchr(pcVar5,0x2d,__n_00);
    __pos = (long)pvVar3 - (long)pcVar5;
    if (__pos != 0xffffffffffffffff && pvVar3 != (void *)0x0) {
      do {
        if ((__pos < __n_00 - 1) &&
           (pcVar5 = (unit_string->_M_dataplus)._M_p, (byte)(pcVar5[__pos + 1] - 0x30U) < 10)) {
          __n = __n_00 - (__pos + 1);
          if (__n_00 < __pos + 1 || __n == 0) break;
          __s = pcVar5 + __pos + 1;
        }
        else {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          erase((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                __pos,1);
          __n_00 = unit_string->_M_string_length;
          __n = __n_00 - __pos;
          if (__n_00 < __pos || __n == 0) break;
          pcVar5 = (unit_string->_M_dataplus)._M_p;
          __s = pcVar5 + __pos;
        }
        pvVar3 = memchr(__s,0x2d,__n);
        if ((pvVar3 == (void *)0x0) ||
           (__pos = (long)pvVar3 - (long)pcVar5, __pos == 0xffffffffffffffff)) break;
      } while( true );
    }
  }
  _Var4._M_current = (unit_string->_M_dataplus)._M_p;
  uStack_38 = CONCAT17(0x2b,(undefined7)uStack_38);
  _Var4 = std::
          __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    (_Var4,_Var4._M_current + __n_00,(char *)((long)&uStack_38 + 7));
  unit_string->_M_string_length = (long)_Var4._M_current - (long)(unit_string->_M_dataplus)._M_p;
  *_Var4._M_current = '\0';
  clearEmptySegments(unit_string);
  return bVar2 || sVar1 != unit_string->_M_string_length;
}

Assistant:

static bool cleanUnitStringPhase2(std::string& unit_string)
{
    bool changed{false};
    auto len = unit_string.length();

    if (bracketModifiers(unit_string)) {
        changed = true;
    }

    // cleanup extraneous dashes
    auto dpos = unit_string.find_first_of('-');
    while (dpos != std::string::npos) {
        if (dpos < unit_string.size() - 1) {
            if (unit_string[dpos + 1] >= '0' && unit_string[dpos + 1] <= '9') {
                dpos = unit_string.find_first_of('-', dpos + 1);
                continue;
            }
        }

        unit_string.erase(dpos, 1);
        dpos = unit_string.find_first_of('-', dpos);
    }
    unit_string.erase(
        std::remove(unit_string.begin(), unit_string.end(), '+'),
        unit_string.end());

    clearEmptySegments(unit_string);

    return changed || (len != unit_string.length());
}